

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O2

int __thiscall vkt::Draw::IndirectDrawTests::init(IndirectDrawTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  _Alloc_hider name;
  int in_EAX;
  TestNode *pTVar2;
  mapped_type *ppcVar3;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *pIVar4;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
  *pIVar5;
  TestNode *this_00;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
  *pIVar6;
  int iVar7;
  allocator<char> local_236;
  allocator<char> local_235;
  int local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  TestNode *local_210;
  string local_208;
  TestNode *local_1e8;
  TestNode *local_1e0;
  TestSpec testSpec;
  string drawTypeStr;
  DrawTypedTestSpec local_180;
  DrawTypedTestSpec local_148;
  DrawTypedTestSpec local_110;
  DrawTypedTestSpec local_d8;
  DrawTypedTestSpec local_a0;
  DrawTypedTestSpec local_68;
  
  local_1e0 = (TestNode *)this;
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    drawTypeStr._M_dataplus._M_p = (pointer)&drawTypeStr.field_2;
    drawTypeStr._M_string_length = 0;
    drawTypeStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&drawTypeStr);
    local_210 = (TestNode *)operator_new(0x70);
    name = drawTypeStr._M_dataplus;
    pTVar1 = ((TestNode *)this)->m_testCtx;
    std::operator+(&local_230,"Draws geometry using ",&drawTypeStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&testSpec,
                   &local_230,"draw call");
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_210,pTVar1,name._M_p,
               (char *)testSpec.super_TestSpecBase.shaders._M_t._M_impl._0_8_);
    std::__cxx11::string::~string((string *)&testSpec);
    std::__cxx11::string::~string((string *)&local_230);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,((TestNode *)this)->m_testCtx,"indirect_draw",
               "Draws geometry");
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_230._M_dataplus._M_p._0_4_ = 0;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    testSpec.super_TestSpecBase._52_4_ = iVar7;
    ppcVar3 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)&testSpec,(key_type *)&local_230);
    *ppcVar3 = "vulkan/draw/VertexFetch.vert";
    local_230._M_dataplus._M_p._0_4_ = 1;
    ppcVar3 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)&testSpec,(key_type *)&local_230);
    *ppcVar3 = "vulkan/draw/VertexFetch.frag";
    testSpec.super_TestSpecBase.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    local_234 = iVar7;
    pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *)operator_new(0xa8);
    pTVar1 = ((TestNode *)this)->m_testCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"triangle_list",&local_235);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Draws triangle list",&local_236);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_68,(DrawTypedTestSpec *)&testSpec);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw>::InstanceFactory
              (pIVar4,pTVar1,&local_230,&local_208,&local_68);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_68);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_230);
    testSpec.super_TestSpecBase.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *)operator_new(0xa8);
    pTVar1 = ((TestNode *)this)->m_testCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"triangle_strip",&local_235);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Draws triangle strip",&local_236);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_a0,(DrawTypedTestSpec *)&testSpec);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw>::InstanceFactory
              (pIVar4,pTVar1,&local_230,&local_208,&local_a0);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_a0);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_230);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&testSpec);
    tcu::TestNode::addChild(local_210,pTVar2);
    iVar7 = local_234;
    local_1e8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1e8,((TestNode *)this)->m_testCtx,"indirect_draw_instanced",
               "Draws an instanced geometry");
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,((TestNode *)this)->m_testCtx,"no_first_instance",
               "Use 0 as firstInstance");
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    testSpec.super_TestSpecBase._52_4_ = iVar7;
    local_230._M_dataplus._M_p._0_4_ = 0;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppcVar3 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)&testSpec,(key_type *)&local_230);
    *ppcVar3 = "vulkan/draw/VertexFetchInstanced.vert";
    local_230._M_dataplus._M_p._0_4_ = 1;
    ppcVar3 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)&testSpec,(key_type *)&local_230);
    *ppcVar3 = "vulkan/draw/VertexFetch.frag";
    testSpec.super_TestSpecBase.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    pIVar5 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
              *)operator_new(0xa8);
    pTVar1 = ((TestNode *)this)->m_testCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"triangle_list",&local_235);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Draws an instanced triangle list",&local_236);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_d8,(DrawTypedTestSpec *)&testSpec);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
    ::InstanceFactory(pIVar5,pTVar1,&local_230,&local_208,&local_d8);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_d8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_230);
    testSpec.super_TestSpecBase.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pIVar5 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
              *)operator_new(0xa8);
    pTVar1 = local_1e0->m_testCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"triangle_strip",&local_235);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Draws an instanced triangle strip",&local_236);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_110,(DrawTypedTestSpec *)&testSpec);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
    ::InstanceFactory(pIVar5,pTVar1,&local_230,&local_208,&local_110);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_110);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_230);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&testSpec);
    tcu::TestNode::addChild(local_1e8,pTVar2);
    pTVar2 = local_1e0;
    iVar7 = local_234;
    this_00 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,pTVar2->m_testCtx,"first_instance",
               "Use drawIndirectFirstInstance optional feature");
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    testSpec.super_TestSpecBase._52_4_ = iVar7;
    local_230._M_dataplus._M_p._0_4_ = 0;
    testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppcVar3 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)&testSpec,(key_type *)&local_230);
    *ppcVar3 = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
    local_230._M_dataplus._M_p._0_4_ = 1;
    ppcVar3 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)&testSpec,(key_type *)&local_230);
    *ppcVar3 = "vulkan/draw/VertexFetch.frag";
    testSpec.super_TestSpecBase.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    pIVar6 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
              *)operator_new(0xa8);
    pTVar1 = pTVar2->m_testCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"triangle_list",&local_235);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Draws an instanced triangle list",&local_236);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_148,(DrawTypedTestSpec *)&testSpec);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
    ::InstanceFactory(pIVar6,pTVar1,&local_230,&local_208,&local_148);
    tcu::TestNode::addChild(this_00,(TestNode *)pIVar6);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_148);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_230);
    testSpec.super_TestSpecBase.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pIVar6 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
              *)operator_new(0xa8);
    pTVar1 = local_1e0->m_testCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"triangle_strip",&local_235);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Draws an instanced triangle strip",&local_236);
    Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec
              (&local_180,(DrawTypedTestSpec *)&testSpec);
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
    ::InstanceFactory(pIVar6,pTVar1,&local_230,&local_208,&local_180);
    tcu::TestNode::addChild(this_00,(TestNode *)pIVar6);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_180);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_230);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&testSpec);
    tcu::TestNode::addChild(local_1e8,this_00);
    this = (IndirectDrawTests *)local_1e0;
    iVar7 = local_234;
    tcu::TestNode::addChild(local_210,local_1e8);
    tcu::TestNode::addChild((TestNode *)this,local_210);
    in_EAX = std::__cxx11::string::~string((string *)&drawTypeStr);
  }
  return in_EAX;
}

Assistant:

void IndirectDrawTests::init (void)
{
	for (int drawTypeIdx = 0; drawTypeIdx < DRAWTYPE_LAST; drawTypeIdx++)
	{
		std::string drawTypeStr;
		switch (drawTypeIdx)
		{
			case DRAW_TYPE_SEQUENTIAL:
				drawTypeStr = "sequential";
				break;
			case DRAW_TYPE_INDEXED:
				drawTypeStr = "indexed";
				break;
			default:
				TCU_FAIL("impossible");
		}

		tcu::TestCaseGroup* drawTypeGroup = new tcu::TestCaseGroup(m_testCtx, drawTypeStr.c_str(), ("Draws geometry using " + drawTypeStr + "draw call").c_str());
		{
			tcu::TestCaseGroup* indirectDrawGroup = new tcu::TestCaseGroup(m_testCtx, "indirect_draw", "Draws geometry");
			{
				IndirectDraw::TestSpec testSpec;
				testSpec.drawType = static_cast<DrawType>(drawTypeIdx);
				testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetch.vert";
				testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";
				testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
				indirectDrawGroup->addChild(new InstanceFactory<IndirectDraw>(m_testCtx, "triangle_list", "Draws triangle list", testSpec));
				testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
				indirectDrawGroup->addChild(new InstanceFactory<IndirectDraw>(m_testCtx, "triangle_strip", "Draws triangle strip", testSpec));
			}
			drawTypeGroup->addChild(indirectDrawGroup);


			tcu::TestCaseGroup* indirectDrawInstancedGroup = new tcu::TestCaseGroup(m_testCtx, "indirect_draw_instanced", "Draws an instanced geometry");
			{
				tcu::TestCaseGroup*	noFirstInstanceGroup = new tcu::TestCaseGroup(m_testCtx, "no_first_instance", "Use 0 as firstInstance");
				{
					IndirectDrawInstanced<FirtsInstanceNotSupported>::TestSpec testSpec;
					testSpec.drawType = static_cast<DrawType>(drawTypeIdx);

					testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstanced.vert";
					testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
					noFirstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceNotSupported> >(m_testCtx, "triangle_list", "Draws an instanced triangle list", testSpec));
					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
					noFirstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceNotSupported> >(m_testCtx, "triangle_strip", "Draws an instanced triangle strip", testSpec));
				}
				indirectDrawInstancedGroup->addChild(noFirstInstanceGroup);

				tcu::TestCaseGroup*	firstInstanceGroup = new tcu::TestCaseGroup(m_testCtx, "first_instance", "Use drawIndirectFirstInstance optional feature");
				{
					IndirectDrawInstanced<FirtsInstanceSupported>::TestSpec testSpec;
					testSpec.drawType = static_cast<DrawType>(drawTypeIdx);

					testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
					testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
					firstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceSupported> >(m_testCtx, "triangle_list", "Draws an instanced triangle list", testSpec));
					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
					firstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceSupported> >(m_testCtx, "triangle_strip", "Draws an instanced triangle strip", testSpec));
				}
				indirectDrawInstancedGroup->addChild(firstInstanceGroup);
			}
			drawTypeGroup->addChild(indirectDrawInstancedGroup);
		}

		addChild(drawTypeGroup);
	}
}